

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.c
# Opt level: O2

void write_archive(archive *a,bsdtar *bsdtar)

{
  char cVar1;
  FILE *pFVar2;
  ulong uVar3;
  int iVar4;
  wchar_t wVar5;
  int code;
  char *pcVar6;
  archive_entry_linkresolver *res;
  archive *paVar7;
  lafe_line_reader *lr;
  char **ppcVar8;
  char *pcVar9;
  archive_entry *entry_00;
  int64_t iVar10;
  int *piVar11;
  ulong uVar12;
  archive_vtable_conflict *filename;
  archive_entry *entry;
  archive_vtable_conflict *local_40;
  archive_entry *sparse_entry;
  
  uVar3 = 0x10000;
  do {
    uVar12 = uVar3;
    uVar3 = uVar12 * 2;
  } while (uVar12 < (ulong)(long)bsdtar->bytes_per_block);
  bsdtar->buff_size = uVar12 | 0x4000;
  pcVar6 = (char *)malloc(uVar12 | 0x4000);
  bsdtar->buff = pcVar6;
  if (pcVar6 == (char *)0x0) {
    pcVar6 = "cannot allocate memory";
  }
  else {
    res = archive_entry_linkresolver_new();
    bsdtar->resolver = res;
    if (res == (archive_entry_linkresolver *)0x0) {
      pcVar6 = "cannot create link resolver";
    }
    else {
      iVar4 = archive_format(a);
      archive_entry_linkresolver_set_strategy(res,iVar4);
      paVar7 = archive_read_disk_new();
      bsdtar->diskreader = paVar7;
      if (paVar7 != (archive *)0x0) {
        if (bsdtar->symlink_mode == 'L') {
          archive_read_disk_set_symlink_logical(paVar7);
        }
        else if (bsdtar->symlink_mode == 'H') {
          archive_read_disk_set_symlink_hybrid(paVar7);
        }
        else {
          archive_read_disk_set_symlink_physical(paVar7);
        }
        archive_read_disk_set_matching(bsdtar->diskreader,bsdtar->matching,excluded_callback,bsdtar)
        ;
        archive_read_disk_set_metadata_filter_callback(bsdtar->diskreader,metadata_filter,bsdtar);
        pcVar6 = (char *)(ulong)(uint)bsdtar->readdisk_flags;
        archive_read_disk_set_behavior(bsdtar->diskreader,bsdtar->readdisk_flags);
        archive_read_disk_set_standard_lookup(bsdtar->diskreader);
        if (bsdtar->names_from_file != (char *)0x0) {
          bsdtar->next_line_is_dir = '\0';
          pcVar6 = (char *)(ulong)(uint)(int)bsdtar->option_null;
          lr = lafe_line_reader(bsdtar->names_from_file,(int)bsdtar->option_null);
LAB_001120f0:
          do {
            paVar7 = (archive *)lafe_line_reader_next(lr);
            if (paVar7 == (archive *)0x0) goto LAB_00112189;
            if (bsdtar->next_line_is_dir == '\0') {
              cVar1 = (char)paVar7->magic;
              if ((bsdtar->option_null == '\0') && (cVar1 == '-')) {
                if ((*(char *)((long)&paVar7->magic + 1) == 'C') &&
                   (*(char *)((long)&paVar7->magic + 2) == '\0')) {
                  bsdtar->next_line_is_dir = '\x01';
                  goto LAB_001120f0;
                }
LAB_0011216e:
                do_chdir((bsdtar_conflict *)bsdtar);
              }
              else if (cVar1 != '/') goto LAB_0011216e;
              pcVar6 = (char *)a;
              write_hierarchy(bsdtar,a,(char *)paVar7);
              goto LAB_001120f0;
            }
            if ((char)paVar7->magic == '\0') {
              pcVar6 = "Meaningless argument for -C: \'\'";
              lafe_warnc(0,"Meaningless argument for -C: \'\'");
              bsdtar->return_value = 1;
            }
            else {
              set_chdir((bsdtar_conflict *)bsdtar,(char *)paVar7);
              pcVar6 = (char *)paVar7;
            }
            bsdtar->next_line_is_dir = '\0';
          } while( true );
        }
        goto LAB_0011219f;
      }
      pcVar6 = "Cannot create read_disk object";
    }
  }
  iVar4 = 0;
LAB_001126d3:
  lafe_errc(1,iVar4,pcVar6);
LAB_00112189:
  lafe_line_reader_free(lr);
  if (bsdtar->next_line_is_dir != '\0') {
    piVar11 = __errno_location();
    iVar4 = *piVar11;
    pcVar6 = "Unexpected end of filename list; directory expected after -C";
    goto LAB_001126d3;
  }
LAB_0011219f:
  ppcVar8 = bsdtar->argv;
LAB_001121a9:
  pcVar9 = *ppcVar8;
  if (pcVar9 == (char *)0x0) goto LAB_00112496;
  cVar1 = *pcVar9;
  if (cVar1 == '@') {
    if (pcVar9[1] != '/') {
LAB_001121ee:
      do_chdir((bsdtar_conflict *)bsdtar);
      if (*pcVar9 != '@') goto LAB_0011240f;
    }
    local_40 = (archive_vtable_conflict *)(pcVar9 + 1);
    filename = local_40;
    if ((pcVar9[1] == '-') && (pcVar9[2] == '\0')) {
      filename = (archive_vtable_conflict *)0x0;
    }
    paVar7 = archive_read_new();
    archive_read_support_format_all(paVar7);
    archive_read_support_filter_all(paVar7);
    set_reader_options((bsdtar *)a,(archive *)pcVar6);
    archive_read_set_options(paVar7,"mtree:checkfs");
    wVar5 = archive_read_open_filename(paVar7,(char *)filename,(long)bsdtar->bytes_per_block);
    if (wVar5 == L'\0') {
LAB_001123ed:
      do {
        pcVar6 = (char *)&entry;
        iVar4 = archive_read_next_header(paVar7,&entry);
        if (iVar4 != 0) goto code_r0x00112400;
        wVar5 = archive_match_excluded(bsdtar->matching,entry);
        if (wVar5 == L'\0') {
          if (bsdtar->option_interactive != '\0') {
            pcVar6 = archive_entry_pathname(entry);
            wVar5 = yes("copy \'%s\'",pcVar6);
            if (wVar5 == L'\0') goto LAB_001123ed;
          }
          pFVar2 = _stderr;
          if (bsdtar->verbose != 0) {
            pcVar6 = archive_entry_pathname(entry);
            safe_fprintf((FILE_conflict *)pFVar2,"a %s",pcVar6);
          }
          iVar4 = need_report();
          if (iVar4 != 0) {
            report_write(bsdtar,a,entry,0);
          }
          iVar4 = archive_write_header(a,entry);
          pFVar2 = _stderr;
          if (iVar4 == 0) {
LAB_00112376:
            iVar10 = archive_entry_size(entry);
            if (iVar10 == 0) {
              archive_read_data_skip(paVar7);
            }
            else {
              iVar4 = copy_file_data_block(bsdtar,a,paVar7,entry);
              if (iVar4 != 0) {
LAB_001126ad:
                exit(1);
              }
            }
          }
          else {
            if (bsdtar->verbose == 0) {
              pcVar6 = archive_entry_pathname(entry);
              archive_error_string(a);
              lafe_warnc(0,"%s: %s",pcVar6);
            }
            else {
              pcVar6 = archive_error_string(a);
              fprintf(pFVar2,": %s",pcVar6);
            }
            if (iVar4 == -0x1e) goto LAB_001126ad;
            if (-0x15 < iVar4) goto LAB_00112376;
          }
          if (bsdtar->verbose != 0) {
            fputc(10,_stderr);
          }
        }
      } while( true );
    }
    pcVar9 = archive_error_string(paVar7);
    pcVar6 = "%s";
    lafe_warnc(0,"%s",pcVar9);
    bsdtar->return_value = 1;
  }
  else {
    if (cVar1 == '/') {
LAB_0011240f:
      pcVar6 = (char *)a;
      write_hierarchy(bsdtar,a,pcVar9);
      goto LAB_0011241d;
    }
    if ((cVar1 != '-') || (pcVar9[1] != 'C')) goto LAB_001121ee;
    if (pcVar9[2] == '\0') {
      bsdtar->argv = ppcVar8 + 1;
      pcVar6 = ppcVar8[1];
      if ((archive *)pcVar6 == (archive *)0x0) {
        pcVar6 = "Missing argument for -C";
        goto LAB_001125ec;
      }
      if ((char)((archive *)pcVar6)->magic == '\0') {
        lafe_warnc(0,"Meaningless argument for -C: \'\'");
        goto LAB_001125f3;
      }
    }
    else {
      pcVar6 = pcVar9 + 2;
    }
    set_chdir((bsdtar_conflict *)bsdtar,pcVar6);
  }
LAB_0011241d:
  ppcVar8 = bsdtar->argv + 1;
  bsdtar->argv = ppcVar8;
  goto LAB_001121a9;
code_r0x00112400:
  if (iVar4 != 1) {
    archive_error_string(paVar7);
    lafe_warnc(0,"Error reading archive %s: %s",local_40);
    bsdtar->return_value = 1;
    archive_read_free(paVar7);
    goto LAB_00112496;
  }
  archive_read_free(paVar7);
  goto LAB_0011241d;
LAB_00112496:
  archive_read_disk_set_matching
            (bsdtar->diskreader,(archive *)0x0,
             (_func_void_archive_ptr_void_ptr_archive_entry_ptr *)0x0,(void *)0x0);
  archive_read_disk_set_metadata_filter_callback
            (bsdtar->diskreader,(_func_int_archive_ptr_void_ptr_archive_entry_ptr *)0x0,(void *)0x0)
  ;
  entry = (archive_entry *)0x0;
  archive_entry_linkify(bsdtar->resolver,&entry,&sparse_entry);
LAB_001124d7:
  do {
    if (entry == (archive_entry *)0x0) {
      iVar4 = archive_write_close(a);
      if (iVar4 != 0) {
        pcVar6 = archive_error_string(a);
LAB_001125ec:
        lafe_warnc(0,"%s",pcVar6);
LAB_001125f3:
        bsdtar->return_value = 1;
      }
      free(bsdtar->buff);
      archive_entry_linkresolver_free(bsdtar->resolver);
      bsdtar->resolver = (archive_entry_linkresolver *)0x0;
      archive_read_free(bsdtar->diskreader);
      bsdtar->diskreader = (archive *)0x0;
      pFVar2 = _stderr;
      if (bsdtar->option_totals != '\0') {
        iVar10 = archive_filter_bytes(a,-1);
        pcVar6 = tar_i64toa(iVar10);
        fprintf(pFVar2,"Total bytes written: %s\n",pcVar6);
      }
      archive_write_free(a);
      return;
    }
    paVar7 = bsdtar->diskreader;
    pcVar6 = archive_entry_sourcepath(entry);
    wVar5 = archive_read_disk_open(paVar7,pcVar6);
    if (wVar5 == L'\0') {
      entry_00 = archive_entry_new();
      iVar4 = archive_read_next_header2(paVar7,entry_00);
      archive_entry_free(entry_00);
      if (iVar4 == 0) {
        write_file(bsdtar,a,entry);
        archive_entry_free(entry);
        archive_read_close(paVar7);
        entry = (archive_entry *)0x0;
        archive_entry_linkify(bsdtar->resolver,&entry,&sparse_entry);
        goto LAB_001124d7;
      }
      code = archive_errno(paVar7);
      pcVar6 = archive_error_string(paVar7);
      lafe_warnc(code,"%s",pcVar6);
      if (iVar4 == -0x1e) goto LAB_00112522;
      archive_read_close(paVar7);
    }
    else {
      iVar4 = archive_errno(paVar7);
      pcVar6 = archive_error_string(paVar7);
      lafe_warnc(iVar4,"%s",pcVar6);
LAB_00112522:
      bsdtar->return_value = 1;
    }
    archive_entry_free(entry);
  } while( true );
}

Assistant:

static void
write_archive(struct archive *a, struct bsdtar *bsdtar)
{
	const char *arg;
	struct archive_entry *entry, *sparse_entry;

	/* Choose a suitable copy buffer size */
	bsdtar->buff_size = 64 * 1024;
	while (bsdtar->buff_size < (size_t)bsdtar->bytes_per_block)
	  bsdtar->buff_size *= 2;
	/* Try to compensate for space we'll lose to alignment. */
	bsdtar->buff_size += 16 * 1024;

	/* Allocate a buffer for file data. */
	if ((bsdtar->buff = malloc(bsdtar->buff_size)) == NULL)
		lafe_errc(1, 0, "cannot allocate memory");

	if ((bsdtar->resolver = archive_entry_linkresolver_new()) == NULL)
		lafe_errc(1, 0, "cannot create link resolver");
	archive_entry_linkresolver_set_strategy(bsdtar->resolver,
	    archive_format(a));

	/* Create a read_disk object. */
	if ((bsdtar->diskreader = archive_read_disk_new()) == NULL)
		lafe_errc(1, 0, "Cannot create read_disk object");
	/* Tell the read_disk how handle symlink. */
	switch (bsdtar->symlink_mode) {
	case 'H':
		archive_read_disk_set_symlink_hybrid(bsdtar->diskreader);
		break;
	case 'L':
		archive_read_disk_set_symlink_logical(bsdtar->diskreader);
		break;
	default:
		archive_read_disk_set_symlink_physical(bsdtar->diskreader);
		break;
	}
	/* Register entry filters. */
	archive_read_disk_set_matching(bsdtar->diskreader,
	    bsdtar->matching, excluded_callback, bsdtar);
	archive_read_disk_set_metadata_filter_callback(
	    bsdtar->diskreader, metadata_filter, bsdtar);
	/* Set the behavior of archive_read_disk. */
	archive_read_disk_set_behavior(bsdtar->diskreader,
	    bsdtar->readdisk_flags);
	archive_read_disk_set_standard_lookup(bsdtar->diskreader);

	if (bsdtar->names_from_file != NULL)
		archive_names_from_file(bsdtar, a);

	while (*bsdtar->argv) {
		arg = *bsdtar->argv;
		if (arg[0] == '-' && arg[1] == 'C') {
			arg += 2;
			if (*arg == '\0') {
				bsdtar->argv++;
				arg = *bsdtar->argv;
				if (arg == NULL) {
					lafe_warnc(0, "%s",
					    "Missing argument for -C");
					bsdtar->return_value = 1;
					goto cleanup;
				}
				if (*arg == '\0') {
					lafe_warnc(0,
					    "Meaningless argument for -C: ''");
					bsdtar->return_value = 1;
					goto cleanup;
				}
			}
			set_chdir(bsdtar, arg);
		} else {
			if (*arg != '/' && (arg[0] != '@' || arg[1] != '/'))
				do_chdir(bsdtar); /* Handle a deferred -C */
			if (*arg == '@') {
				if (append_archive_filename(bsdtar, a,
				    arg + 1) != 0)
					break;
			} else
				write_hierarchy(bsdtar, a, arg);
		}
		bsdtar->argv++;
	}

	archive_read_disk_set_matching(bsdtar->diskreader, NULL, NULL, NULL);
	archive_read_disk_set_metadata_filter_callback(
	    bsdtar->diskreader, NULL, NULL);
	entry = NULL;
	archive_entry_linkify(bsdtar->resolver, &entry, &sparse_entry);
	while (entry != NULL) {
		int r;
		struct archive_entry *entry2;
		struct archive *disk = bsdtar->diskreader;

		/*
		 * This tricky code here is to correctly read the cotents
		 * of the entry because the disk reader bsdtar->diskreader
		 * is pointing at does not have any information about the
		 * entry by this time and using archive_read_data_block()
		 * with the disk reader consequently must fail. And we
		 * have to re-open the entry to read the contents.
		 */
		/* TODO: Work with -C option as well. */
		r = archive_read_disk_open(disk,
			archive_entry_sourcepath(entry));
		if (r != ARCHIVE_OK) {
			lafe_warnc(archive_errno(disk),
			    "%s", archive_error_string(disk));
			bsdtar->return_value = 1;
			archive_entry_free(entry);
			continue;
		}

		/*
		 * Invoke archive_read_next_header2() to work
		 * archive_read_data_block(), which is called via write_file(),
		 * without failure.
		 */
		entry2 = archive_entry_new();
		r = archive_read_next_header2(disk, entry2);
		archive_entry_free(entry2);
		if (r != ARCHIVE_OK) {
			lafe_warnc(archive_errno(disk),
			    "%s", archive_error_string(disk));
			if (r == ARCHIVE_FATAL)
				bsdtar->return_value = 1;
			else
				archive_read_close(disk);
			archive_entry_free(entry);
			continue;
		}

		write_file(bsdtar, a, entry);
		archive_entry_free(entry);
		archive_read_close(disk);
		entry = NULL;
		archive_entry_linkify(bsdtar->resolver, &entry, &sparse_entry);
	}

	if (archive_write_close(a)) {
		lafe_warnc(0, "%s", archive_error_string(a));
		bsdtar->return_value = 1;
	}

cleanup:
	/* Free file data buffer. */
	free(bsdtar->buff);
	archive_entry_linkresolver_free(bsdtar->resolver);
	bsdtar->resolver = NULL;
	archive_read_free(bsdtar->diskreader);
	bsdtar->diskreader = NULL;

	if (bsdtar->option_totals) {
		fprintf(stderr, "Total bytes written: %s\n",
		    tar_i64toa(archive_filter_bytes(a, -1)));
	}

	archive_write_free(a);
}